

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O2

Function * __thiscall
wasm::anon_unknown_18::FunctionSplitter::copyFunction
          (FunctionSplitter *this,Function *func,string *prefix)

{
  Module *module;
  Function *pFVar1;
  Name NVar2;
  Name newName;
  undefined8 in_stack_ffffffffffffff28;
  _Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string_view local_38;
  
  std::operator+(&local_58,"byn-split-",prefix);
  std::__cxx11::string::operator=((string *)prefix,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  module = this->module;
  std::operator+(&local_98,prefix,'$');
  IString::toString_abi_cxx11_(&local_78,(IString *)func);
  std::operator+(&local_58,&local_98,&local_78);
  IString::IString((IString *)&local_38,&local_58);
  NVar2 = Names::getValidFunctionName(module,(Name)local_38);
  local_b8._M_engaged = false;
  newName.super_IString.str._M_str = &stack0xffffffffffffff28;
  newName.super_IString.str._M_len = (size_t)NVar2.super_IString.str._M_str;
  pFVar1 = wasm::ModuleUtils::copyFunction
                     ((ModuleUtils *)func,(Function *)module,NVar2.super_IString.str._M_len,newName,
                      (optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                      &local_b8,
                      (optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                      in_stack_ffffffffffffff28);
  std::_Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::_M_reset
            (&local_b8);
  std::_Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::_M_reset
            ((_Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
             &stack0xffffffffffffff28);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  return pFVar1;
}

Assistant:

Function* copyFunction(Function* func, std::string prefix) {
    // TODO: We copy quite a lot more than we need here, and throw stuff out.
    //       It is simple to just copy the entire thing to get the params and
    //       results and all that, but we could be more efficient.
    prefix = "byn-split-" + prefix;
    return ModuleUtils::copyFunction(
      func,
      *module,
      Names::getValidFunctionName(*module,
                                  prefix + '$' + func->name.toString()));
  }